

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ByteData * __thiscall
cfd::core::ExtPubkey::GetVersionData(ByteData *__return_storage_ptr__,ExtPubkey *this)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  value_type vVar1;
  uint32_t uVar2;
  reference pvVar3;
  allocator_type *__a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  undefined1 local_31 [9];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_data;
  ExtPubkey *this_local;
  
  this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_31;
  __a = (allocator_type *)__return_storage_ptr__;
  byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x449b30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this_01,(size_type)this,__a);
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x449b4d);
  vVar1 = *(value_type *)((long)&this->version_ + 3);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_31 + 1);
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,0);
  *pvVar3 = vVar1;
  vVar1 = *(value_type *)((long)&this->version_ + 2);
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,1);
  *pvVar3 = vVar1;
  vVar1 = *(value_type *)((long)&this->version_ + 1);
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,2);
  *pvVar3 = vVar1;
  uVar2 = this->version_;
  pvVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this_00,3);
  *pvVar3 = (value_type)uVar2;
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__a);
  return (ByteData *)__a;
}

Assistant:

ByteData ExtPubkey::GetVersionData() const {
  std::vector<uint8_t> byte_data(4);
  byte_data[0] = (version_ >> 24) & 0xff;
  byte_data[1] = (version_ >> 16) & 0xff;
  byte_data[2] = (version_ >> 8) & 0xff;
  byte_data[3] = version_ & 0xff;
  return ByteData(byte_data);
}